

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::ExtensionSet::GetMessageByteSizeLong(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  size_t sVar2;
  string_view str;
  LogMessage LStack_18;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x20d,"extension != nullptr");
    str._M_str = "not present";
    str._M_len = 0xb;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_18,str)
    ;
    goto LAB_003fc674;
  }
  if (pEVar1->is_repeated == false) {
    if ((byte)(pEVar1->type - 0x13) < 0xee) goto LAB_003fc664;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 10) {
      if ((pEVar1->field_0xa & 4) == 0) {
        sVar2 = (**(code **)(*(long *)pEVar1->field_0 + 0x18))();
        return sVar2;
      }
      sVar2 = (**(code **)(*(long *)pEVar1->field_0 + 0x68))();
      return sVar2;
    }
  }
  else {
    GetMessageByteSizeLong();
LAB_003fc664:
    GetMessageByteSizeLong();
  }
  GetMessageByteSizeLong();
LAB_003fc674:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_18)
  ;
}

Assistant:

size_t ExtensionSet::GetMessageByteSizeLong(int number) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "not present";
  ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
  return extension->is_lazy ? extension->ptr.lazymessage_value->ByteSizeLong()
                            : extension->ptr.message_value->ByteSizeLong();
}